

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::RecyclableArrayWalker::Get(RecyclableArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *arrayObj;
  ArenaAllocator *alloc;
  RecyclableArrayAddress *this_00;
  uint local_2c [2];
  uint32 absIndex;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb8f,"(pResolvedObject)","Bad usage of RecyclableArrayWalker::Get"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if ((!bVar2) &&
     (bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance), !bVar2)) {
    return 0;
  }
  arrayObj = GetArrayObject(this);
  uVar3 = 0;
  if (this->fOnlyOwnProperties == false) {
    uVar3 = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker);
  }
  if ((int)uVar3 <= i) {
    GetResolvedObject(this,arrayObj,i - uVar3,pResolvedObject,local_2c);
    alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    this_00 = (RecyclableArrayAddress *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
    RecyclableArrayAddress::RecyclableArrayAddress
              (this_00,(this->super_RecyclableObjectWalker).instance,local_2c[0]);
    pResolvedObject->address = (IDiagObjectAddress *)this_00;
    return 1;
  }
  BVar4 = RecyclableObjectWalker::Get(&this->super_RecyclableObjectWalker,i,pResolvedObject);
  return BVar4;
}

Assistant:

BOOL RecyclableArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableArrayWalker::Get");

        if (Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))
        {
            Js::JavascriptArray* arrayObj = GetArrayObject();

            int nonArrayElementCount = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

            if (i < nonArrayElementCount)
            {
                return RecyclableObjectWalker::Get(i, pResolvedObject);
            }
            else
            {
                i -= nonArrayElementCount;
                uint32 absIndex; // Absolute index
                GetResolvedObject(arrayObj, i, pResolvedObject, &absIndex);

                pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                    RecyclableArrayAddress,
                    instance,
                    absIndex);

                return TRUE;
            }
        }
        return FALSE;
    }